

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveData.cpp
# Opt level: O2

void __thiscall CDirectiveData::encodeFloat(CDirectiveData *this)

{
  vector<long,_std::allocator<long>_> *this_00;
  pointer plVar1;
  pointer pEVar2;
  int32_t iVar3;
  EncodingMode EVar4;
  EncodingMode EVar5;
  long lVar6;
  char *text;
  ulong uVar7;
  int64_t num;
  ExpressionValue value;
  
  plVar1 = (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish != plVar1) {
    (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = plVar1;
  }
  this_00 = &this->normalData;
  lVar6 = 0;
  uVar7 = 0;
  do {
    pEVar2 = (this->entries).super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->entries).super__Vector_base<Expression,_std::allocator<Expression>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pEVar2) / 0x18) <= uVar7) {
      return;
    }
    Expression::evaluate
              (&value,(Expression *)
                      ((long)&(pEVar2->expression).
                              super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + lVar6));
    text = "Invalid expression";
    if (value.type == Invalid) {
LAB_00173195:
      Logger::queueError<>(Error,text);
    }
    else {
      EVar5 = this->mode ^ Float;
      if ((value.type ^ Integer) == Invalid && EVar5 == Invalid) {
        iVar3 = getFloatBits((float)value.field_1.intValue);
        num = (int64_t)iVar3;
        std::vector<long,_std::allocator<long>_>::emplace_back<long>(this_00,&num);
      }
      else {
        EVar4 = this->mode ^ Double;
        if ((value.type ^ Integer) == Invalid && EVar4 == Invalid) {
          num = getDoubleBits((double)value.field_1.intValue);
          std::vector<long,_std::allocator<long>_>::push_back(this_00,&num);
        }
        else if (EVar5 == Invalid && (value.type ^ Float) == Invalid) {
          iVar3 = getFloatBits((float)value.field_1.floatValue);
          num = (int64_t)iVar3;
          std::vector<long,_std::allocator<long>_>::emplace_back<long>(this_00,&num);
        }
        else {
          text = "Invalid expression type";
          if ((value.type ^ Float) != Invalid || EVar4 != Invalid) goto LAB_00173195;
          num = getDoubleBits(value.field_1.floatValue);
          std::vector<long,_std::allocator<long>_>::push_back(this_00,&num);
        }
      }
    }
    std::__cxx11::string::~string((string *)&value.strValue);
    uVar7 = uVar7 + 1;
    lVar6 = lVar6 + 0x18;
  } while( true );
}

Assistant:

void CDirectiveData::encodeFloat()
{
	normalData.clear();
	for (size_t i = 0; i < entries.size(); i++)
	{
		ExpressionValue value = entries[i].evaluate();
		if (!value.isValid())
		{
			Logger::queueError(Logger::Error, "Invalid expression");
			continue;
		}

		if (value.isInt() && mode == EncodingMode::Float)
		{
			int32_t num = getFloatBits((float)value.intValue);
			normalData.push_back(num);
		} else if (value.isInt() && mode == EncodingMode::Double)
		{
			int64_t num = getDoubleBits((double)value.intValue);
			normalData.push_back(num);
		} else if (value.isFloat() && mode == EncodingMode::Float)
		{
			int32_t num = getFloatBits((float)value.floatValue);
			normalData.push_back(num);
		} else if (value.isFloat() && mode == EncodingMode::Double)
		{
			int64_t num = getDoubleBits((double)value.floatValue);
			normalData.push_back(num);
		} else {
			Logger::queueError(Logger::Error, "Invalid expression type");
		}
	}
}